

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int> *map,Var *max)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  Var VVar4;
  char *pcVar5;
  int i;
  ulong uVar6;
  lbool local_49;
  FILE *local_48;
  vec<int> *local_40;
  Var *local_38;
  
  local_48 = (FILE *)f;
  local_40 = map;
  local_38 = max;
  bVar3 = satisfied(this,c);
  if (!bVar3) {
    for (uVar6 = 0; uVar6 < (ulong)c->header >> 0x22; uVar6 = uVar6 + 1) {
      iVar1 = *(int *)(&c[1].header.field_0x0 + uVar6 * 4);
      local_49.value = (byte)iVar1 & 1 ^ (this->assigns).data[iVar1 >> 1].value;
      bVar3 = lbool::operator!=(&local_49,(lbool)0x1);
      if (bVar3) {
        uVar2 = *(uint *)(&c[1].header.field_0x0 + uVar6 * 4);
        pcVar5 = "-";
        if ((uVar2 & 1) == 0) {
          pcVar5 = "";
        }
        VVar4 = mapVar((int)uVar2 >> 1,local_40,local_38);
        fprintf(local_48,"%s%d ",pcVar5,(ulong)(VVar4 + 1));
      }
    }
    fwrite("0\n",2,1,local_48);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE *f, Clause &c, vec<Var> &map, Var &max)
{
    if (satisfied(c)) return;

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) != l_False) fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max) + 1);
    fprintf(f, "0\n");
}